

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstrstream.cpp
# Opt level: O0

void __thiscall OpenMD::ifstrstream::ifstrstream(ifstrstream *this)

{
  long *in_RDI;
  
  std::ios::ios((ios *)(in_RDI + 0x2e));
  std::istream::istream(in_RDI,(streambuf *)&PTR_construction_vtable_24__00526ac0);
  *in_RDI = (long)&PTR__ifstrstream_00526a80;
  in_RDI[0x2e] = (long)&PTR__ifstrstream_00526aa8;
  std::__cxx11::stringbuf::stringbuf((stringbuf *)(in_RDI + 2));
  std::filebuf::filebuf((filebuf *)(in_RDI + 0xf));
  *(undefined1 *)(in_RDI + 0x2d) = 0;
  std::ios::init((streambuf *)((long)in_RDI + *(long *)(*in_RDI + -0x18)));
  return;
}

Assistant:

ifstrstream::ifstrstream() :
      std::basic_istream<char, std::char_traits<char>>(0), internalStringBuf_(),
      isRead(false) {
    this->init(&internalStringBuf_);
  }